

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O2

UChar32 ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  UConverter *pUVar4;
  UBool UVar5;
  uint prev;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  char cVar10;
  long lVar11;
  
  pbVar3 = (byte *)args->source;
  if (args->sourceLimit <= pbVar3) {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0xffff;
  }
  pbVar8 = pbVar3 + 1;
  bVar1 = *pbVar3;
  prev = (uint)bVar1;
  if (-1 < (char)bVar1) {
    args->source = (char *)pbVar8;
    return prev;
  }
  pUVar4 = args->converter;
  if (0x32 < (byte)(bVar1 + 0x3e)) {
    pUVar4->toUBytes[0] = bVar1;
    pUVar4->toULength = '\x01';
    *err = U_ILLEGAL_CHAR_FOUND;
    args->source = (char *)pbVar8;
    return 0xffff;
  }
  uVar6 = ((0xdf < bVar1) + 1) - (uint)(bVar1 < 0xf0);
  if (args->sourceLimit < pbVar8 + (ulong)uVar6 + 1) {
    pUVar4->toUBytes[0] = bVar1;
    *err = U_TRUNCATED_CHAR_FOUND;
    lVar11 = 1;
    do {
      pbVar8 = pbVar3 + lVar11;
      cVar10 = (char)lVar11;
      if (args->sourceLimit <= pbVar8) {
LAB_002b2fc8:
        pUVar4->toULength = cVar10;
        args->source = (char *)pbVar8;
        return 0xffff;
      }
      bVar1 = *pbVar8;
      UVar5 = icu_63::UTF8::isValidTrail(prev,bVar1,(int)cVar10,uVar6 + 2);
      if (UVar5 == '\0') {
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_002b2fc8;
      }
      pUVar4->toUBytes[cVar10] = bVar1;
      lVar11 = lVar11 + 1;
    } while( true );
  }
  iVar9 = prev * 0x40;
  bVar1 = *pbVar8;
  uVar7 = (uint)bVar1;
  if (uVar6 == 0) {
    if ((char)bVar1 < -0x40) {
      args->source = (char *)(pbVar3 + 2);
      return iVar9 + uVar7 + -0x3080;
    }
    goto LAB_002b3043;
  }
  if (uVar6 == 1) {
    if (((byte)" 000000000000\x1000"[prev & 0xf] >> (bVar1 >> 5) & 1) == 0) goto LAB_002b3043;
    bVar1 = pbVar3[2];
    if ((char)bVar1 < -0x40) {
      args->source = (char *)(pbVar3 + 3);
      return (uint)bVar1 + (iVar9 + uVar7) * 0x40 + -0xe2080;
    }
  }
  else {
    if (((byte)""[bVar1 >> 4] >> (prev & 7) & 1) == 0) goto LAB_002b3043;
    bVar1 = pbVar3[2];
    if ((char)bVar1 < -0x40) {
      bVar2 = pbVar3[3];
      if ((char)bVar2 < -0x40) {
        args->source = (char *)(pbVar3 + 4);
        return (uint)bVar1 * 0x40 + (iVar9 + uVar7) * 0x1000 + (uint)bVar2 + -0x3c82080;
      }
      pbVar8 = pbVar3 + 3;
      goto LAB_002b3043;
    }
  }
  pbVar8 = pbVar3 + 2;
LAB_002b3043:
  args->source = (char *)pbVar8;
  lVar11 = 0;
  while( true ) {
    if (pbVar8 <= pbVar3 + lVar11) break;
    pUVar4->toUBytes[(char)lVar11] = pbVar3[lVar11];
    lVar11 = lVar11 + 1;
  }
  pUVar4->toULength = (char)lVar11;
  *err = U_ILLEGAL_CHAR_FOUND;
  return 0xffff;
}

Assistant:

U_CDECL_BEGIN
static UChar32 U_CALLCONV ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,
                                               UErrorCode *err) {
    UConverter *cnv;
    const uint8_t *sourceInitial;
    const uint8_t *source;
    uint8_t myByte;
    UChar32 ch;
    int8_t i;

    /* UTF-8 only here, the framework handles CESU-8 to combine surrogate pairs */

    cnv = args->converter;
    sourceInitial = source = (const uint8_t *)args->source;
    if (source >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    myByte = (uint8_t)*(source++);
    if (U8_IS_SINGLE(myByte))
    {
        args->source = (const char *)source;
        return (UChar32)myByte;
    }

    uint16_t countTrailBytes = U8_COUNT_TRAIL_BYTES(myByte);
    if (countTrailBytes == 0) {
        cnv->toUBytes[0] = myByte;
        cnv->toULength = 1;
        *err = U_ILLEGAL_CHAR_FOUND;
        args->source = (const char *)source;
        return 0xffff;
    }

    /*The byte sequence is longer than the buffer area passed*/
    if (((const char *)source + countTrailBytes) > args->sourceLimit)
    {
        /* check if all of the remaining bytes are trail bytes */
        uint16_t extraBytesToWrite = countTrailBytes + 1;
        cnv->toUBytes[0] = myByte;
        i = 1;
        *err = U_TRUNCATED_CHAR_FOUND;
        while(source < (const uint8_t *)args->sourceLimit) {
            uint8_t b = *source;
            if(icu::UTF8::isValidTrail(myByte, b, i, extraBytesToWrite)) {
                cnv->toUBytes[i++] = b;
                ++source;
            } else {
                /* error even before we run out of input */
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
        cnv->toULength = i;
        args->source = (const char *)source;
        return 0xffff;
    }

    ch = myByte << 6;
    if(countTrailBytes == 2) {
        uint8_t t1 = *source, t2;
        if(U8_IS_VALID_LEAD3_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((ch + t1) << 6) + t2) - offsetsFromUTF8[3];
        }
    } else if(countTrailBytes == 1) {
        uint8_t t1 = *source;
        if(U8_IS_TRAIL(t1)) {
            args->source = (const char *)(source + 1);
            return (ch + t1) - offsetsFromUTF8[2];
        }
    } else {  // countTrailBytes == 3
        uint8_t t1 = *source, t2, t3;
        if(U8_IS_VALID_LEAD4_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source) &&
                U8_IS_TRAIL(t3 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((((ch + t1) << 6) + t2) << 6) + t3) - offsetsFromUTF8[4];
        }
    }
    args->source = (const char *)source;

    for(i = 0; sourceInitial < source; ++i) {
        cnv->toUBytes[i] = *sourceInitial++;
    }
    cnv->toULength = i;
    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}